

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc.h
# Opt level: O3

void __thiscall embree::FastAllocator::addBlock(FastAllocator *this,void *ptr,ssize_t bytes)

{
  __pointer_type pBVar1;
  __pointer_type pBVar2;
  long lVar3;
  __int_type_conflict _Var4;
  
  MutexSys::lock(&this->mutex);
  pBVar2 = (__pointer_type)((long)ptr + 0x3fU & 0xffffffffffffffc0);
  lVar3 = bytes - ((long)pBVar2 - (long)ptr);
  if (0xfff < lVar3) {
    _Var4 = lVar3 - 0x40;
    pBVar1 = (this->freeBlocks)._M_b._M_p;
    (pBVar2->cur).super___atomic_base<unsigned_long>._M_i = 0;
    (pBVar2->allocEnd).super___atomic_base<unsigned_long>._M_i = _Var4;
    (pBVar2->reserveEnd).super___atomic_base<unsigned_long>._M_i = _Var4;
    pBVar2->next = pBVar1;
    pBVar2->wasted = (long)pBVar2 - (long)ptr;
    pBVar2->atype = SHARED;
    pBVar2->huge_pages = false;
    LOCK();
    (this->freeBlocks)._M_b._M_p = pBVar2;
    UNLOCK();
  }
  MutexSys::unlock(&this->mutex);
  return;
}

Assistant:

void addBlock(void* ptr, ssize_t bytes)
    {
      Lock<MutexSys> lock(mutex);
      const size_t sizeof_Header = offsetof(Block,data[0]);
      void* aptr = (void*) ((((size_t)ptr)+maxAlignment-1) & ~(maxAlignment-1));
      size_t ofs = (size_t) aptr - (size_t) ptr;
      bytes -= ofs;
      if (bytes < 4096) return; // ignore empty or very small blocks
      freeBlocks = new (aptr) Block(SHARED,bytes-sizeof_Header,bytes-sizeof_Header,freeBlocks,ofs);
    }